

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O0

void luaE_warnerror(lua_State *L,char *where)

{
  char *local_30;
  char *msg;
  TValue *errobj;
  char *where_local;
  lua_State *L_local;
  
  if ((*(byte *)((L->top).offset + -8) & 0xf) == 4) {
    local_30 = (char *)(*(long *)((L->top).offset + -0x10) + 0x18);
  }
  else {
    local_30 = "error object is not a string";
  }
  luaE_warning(L,"error in ",1);
  luaE_warning(L,where,1);
  luaE_warning(L," (",1);
  luaE_warning(L,local_30,1);
  luaE_warning(L,")",0);
  return;
}

Assistant:

void luaE_warnerror (lua_State *L, const char *where) {
  TValue *errobj = s2v(L->top.p - 1);  /* error object */
  const char *msg = (ttisstring(errobj))
                  ? getstr(tsvalue(errobj))
                  : "error object is not a string";
  /* produce warning "error in %s (%s)" (where, msg) */
  luaE_warning(L, "error in ", 1);
  luaE_warning(L, where, 1);
  luaE_warning(L, " (", 1);
  luaE_warning(L, msg, 1);
  luaE_warning(L, ")", 0);
}